

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<Header>::replace(QList<Header> *this,qsizetype i,rvalue_ref t)

{
  Data *pDVar1;
  Header *pHVar2;
  Data *pDVar3;
  char *pcVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  DataPointer oldData;
  QArrayDataPointer<Header> local_48;
  anon_class_8_1_8991fb9c local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (Data *)0x0;
  local_48.ptr = (Header *)0x0;
  local_48.size = 0;
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<Header>::reallocateAndGrow(&this->d,GrowsAtEnd,0,&local_48);
  }
  pHVar2 = (this->d).ptr;
  local_28.this =
       (_Move_assign_base<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)(pHVar2 + i);
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
    ::_S_vtable._M_arr
    [(long)(char)*(__index_type *)
                  ((long)&(t->name).data.
                          super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                          super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                          super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                          super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                          super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18)
     + 1]._M_data)(&local_28,(variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)t);
  pDVar3 = pHVar2[i].value.d.d;
  pHVar2[i].value.d.d = (t->value).d.d;
  (t->value).d.d = pDVar3;
  pcVar4 = pHVar2[i].value.d.ptr;
  pHVar2[i].value.d.ptr = (t->value).d.ptr;
  (t->value).d.ptr = pcVar4;
  qVar5 = pHVar2[i].value.d.size;
  pHVar2[i].value.d.size = (t->value).d.size;
  (t->value).d.size = qVar5;
  QArrayDataPointer<Header>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void replace(qsizetype i, rvalue_ref t)
    {
        if constexpr (DataPointer::pass_parameter_by_value) {
            Q_UNUSED(i);
            Q_UNUSED(t);
        } else {
            Q_ASSERT_X(i >= 0 && i < d->size, "QList<T>::replace", "index out of range");
            DataPointer oldData;
            d.detach(&oldData);
            d.data()[i] = std::move(t);
        }
    }